

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprListCompare(ExprList *pA,ExprList *pB,int iTab)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  Expr *pExprB;
  Expr *pExprA;
  int res;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int local_20;
  int local_4;
  
  if ((in_RDI == (int *)0x0) && (in_RSI == (int *)0x0)) {
    local_4 = 0;
  }
  else if ((in_RDI == (int *)0x0) || (in_RSI == (int *)0x0)) {
    local_4 = 1;
  }
  else if (*in_RDI == *in_RSI) {
    for (local_20 = 0; local_20 < *in_RDI; local_20 = local_20 + 1) {
      if ((char)in_RDI[(long)local_20 * 6 + 6] != (char)in_RSI[(long)local_20 * 6 + 6]) {
        return 1;
      }
      iVar1 = sqlite3ExprCompare((Parse *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd8),
                                 *(Expr **)(in_RDI + (long)local_20 * 6 + 2),
                                 *(Expr **)(in_RSI + (long)local_20 * 6 + 2),0);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprListCompare(const ExprList *pA, const ExprList *pB, int iTab){
  int i;
  if( pA==0 && pB==0 ) return 0;
  if( pA==0 || pB==0 ) return 1;
  if( pA->nExpr!=pB->nExpr ) return 1;
  for(i=0; i<pA->nExpr; i++){
    int res;
    Expr *pExprA = pA->a[i].pExpr;
    Expr *pExprB = pB->a[i].pExpr;
    if( pA->a[i].fg.sortFlags!=pB->a[i].fg.sortFlags ) return 1;
    if( (res = sqlite3ExprCompare(0, pExprA, pExprB, iTab)) ) return res;
  }
  return 0;
}